

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  long *__nptr;
  byte bVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 uVar8;
  int iVar9;
  char *pcVar10;
  string execution_mode_string;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> filenames;
  string fps_string;
  string filename;
  path directory_path;
  VideoCapture video_capture;
  code *local_138 [2];
  code *local_128;
  code *pcStack_120;
  string local_110;
  ulong local_f0;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_e8;
  long *local_d0;
  ulong local_c8;
  long local_c0 [2];
  long local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  path local_88;
  VideoCapture local_60 [48];
  
  local_e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::VideoCapture::VideoCapture(local_60);
  if (argc != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Expected 3 arguments. Usage: ",0x1d);
    pcVar10 = *argv;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1202a8);
    }
    else {
      sVar7 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               " <path to directory with jpeg images | movie filename> <execution mode> <fps>",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Available execution modes: ",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"1 - simple diff",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)"
               ,0x57);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"3 - flicker remover on CPU",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"4 - flicker remover on GPU",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"IMPORTANT: all images and videos should be in << ",0x31);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,800);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,600);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," pixel format.",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar9 = -1;
    std::ostream::flush();
    goto LAB_0010df13;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,argv[1],(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,argv[3],(allocator<char> *)&local_88);
  __nptr = local_d0;
  piVar4 = __errno_location();
  iVar9 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)__nptr,(char **)&local_88,10);
  if ((long *)local_88._M_pathname._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_0010df4a:
    std::__throw_out_of_range("stoi");
LAB_0010df56:
    std::__throw_invalid_argument("stoi");
LAB_0010df62:
    uVar8 = std::__throw_out_of_range("stoi");
    __clang_call_terminate(uVar8);
  }
  if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_0010df4a;
  if (*piVar4 == 0) {
    *piVar4 = iVar9;
  }
  if ((ulong)((long)local_88._M_pathname._M_dataplus._M_p - (long)__nptr) < local_c8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error in <fps> command line parameter. Trailing characters after number: ",0x49);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_d0,local_c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
LAB_0010d8e5:
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar9 = -1;
    bVar3 = false;
  }
  else {
    if ((int)lVar5 < 0) {
      poVar6 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Error in <fps> command line parameter. Frames per second must have a positive value."
                 ,0x54);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
      goto LAB_0010d8e5;
    }
    iVar9 = 0;
    bVar3 = true;
  }
  if (!bVar3) goto LAB_0010ded7;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_88,&local_a8,auto_format);
  bVar2 = std::filesystem::status(&local_88);
  local_f0 = (ulong)bVar2;
  if (local_f0 != 2) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,local_88._M_pathname._M_dataplus._M_p,
               local_88._M_pathname._M_dataplus._M_p + local_88._M_pathname._M_string_length);
    bVar3 = openVideo(local_60,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    iVar9 = -1;
    if (bVar3) goto LAB_0010da41;
    goto LAB_0010dec7;
  }
  readFilenames(&local_a8,&local_e8);
  if (local_e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not find any jpeg files in directory: ",0x2c);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar9 = -1;
    std::ostream::flush();
    goto LAB_0010dec7;
  }
LAB_0010da41:
  local_b0 = lVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,argv[2],(allocator<char> *)local_138);
  _Var1._M_p = local_110._M_dataplus._M_p;
  iVar9 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(local_110._M_dataplus._M_p,(char **)local_138,10);
  if (local_138[0] == (code *)_Var1._M_p) goto LAB_0010df56;
  if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010df62;
  if (*piVar4 == 0) {
    *piVar4 = iVar9;
  }
  if ((ulong)((long)local_138[0] - (long)_Var1._M_p) < local_110._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error in <execution mode> command line parameter. Trailing characters after number: "
               ,0x54);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_110._M_dataplus._M_p,local_110._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar9 = -1;
    std::ostream::flush();
    goto LAB_0010deac;
  }
  switch((int)lVar5) {
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simple absolute diff of 2 frames.",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if ((int)local_f0 == 2) {
      local_138[1] = (code *)0x0;
      local_138[0] = simpleDiff;
      pcStack_120 = std::
                    _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                    ::_M_invoke;
      local_128 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar3 = iterateImages(&local_e8,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)local_138
                           );
      if (local_128 != (_Manager_type)0x0) {
        (*local_128)((_Any_data *)local_138,(_Any_data *)local_138,__destroy_functor);
      }
      if (bVar3) {
LAB_0010de66:
        iVar9 = 0;
        break;
      }
      lVar5 = 0x48;
      pcVar10 = "Error occurred while iterating over images to produce and display diffs.";
    }
    else {
      local_138[1] = (code *)0x0;
      local_138[0] = simpleDiff;
      pcStack_120 = std::
                    _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                    ::_M_invoke;
      local_128 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar3 = iterateVideoFrames(local_60,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)
                                          local_138);
      if (local_128 != (_Manager_type)0x0) {
        (*local_128)((_Any_data *)local_138,(_Any_data *)local_138,__destroy_functor);
      }
      if (bVar3) goto LAB_0010de66;
      lVar5 = 0x58;
      pcVar10 = 
      "Error occurred while iterating over frames from video file to produce and display diffs.";
    }
    goto LAB_0010de8f;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simple absolute diff of 2 frames with all pixels with values "
               ,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different than 0 (black) set to 255 (white).",0x2c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if ((int)local_f0 == 2) {
      local_138[1] = (code *)0x0;
      local_138[0] = simpleDiffMaxed;
      pcStack_120 = std::
                    _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                    ::_M_invoke;
      local_128 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar3 = iterateImages(&local_e8,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)local_138
                           );
      if (local_128 != (_Manager_type)0x0) {
        (*local_128)((_Any_data *)local_138,(_Any_data *)local_138,__destroy_functor);
      }
      if (bVar3) goto LAB_0010de66;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Error occurred while iterating over images to produce and display diffs with all pixels "
                 ,0x58);
      lVar5 = 0x38;
      pcVar10 = "with values different than 0 (black) set to 255 (white).";
    }
    else {
      local_138[1] = (code *)0x0;
      local_138[0] = simpleDiffMaxed;
      pcStack_120 = std::
                    _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                    ::_M_invoke;
      local_128 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar3 = iterateVideoFrames(local_60,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)
                                          local_138);
      if (local_128 != (_Manager_type)0x0) {
        (*local_128)((_Any_data *)local_138,(_Any_data *)local_138,__destroy_functor);
      }
      if (bVar3) goto LAB_0010de66;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Error occurred while iterating over frames from video file to produce and display diffs "
                 ,0x58);
      lVar5 = 0x48;
      pcVar10 = "with all pixels with values different than 0 (black) set to 255 (white).";
    }
LAB_0010de8f:
    poVar6 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,lVar5);
LAB_0010de9e:
    iVar9 = -1;
    std::endl<char,std::char_traits<char>>(poVar6);
    break;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Flicker remover on CPU.",0x17);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar9 = flickerRemoverOnCPU((int)local_f0 == 2,local_60,&local_e8,(uint)local_b0,600,800);
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Flicker remover on GPU.",0x17);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar9 = flickerRemoverOnGPU((int)local_f0 == 2,local_60,&local_e8,(uint)local_b0,600,800);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unknown execution mode: ",0x18);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_110._M_dataplus._M_p,local_110._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,". It should be an integral value from range: 1 - 6.",0x33);
    goto LAB_0010de9e;
  }
LAB_0010deac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
LAB_0010dec7:
  std::filesystem::__cxx11::path::~path(&local_88);
LAB_0010ded7:
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
LAB_0010df13:
  cv::VideoCapture::~VideoCapture(local_60);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_e8);
  return iVar9;
}

Assistant:

int main(int argc, char *argv[])
{
    vector<path> filenames;
    VideoCapture video_capture;
    unsigned int fps;
    const int rows = 600;
    const int cols = 800;

    if(argc != 4) {
        cout << "Expected 3 arguments. Usage: " << argv[0]
             << " <path to directory with jpeg images | movie filename> <execution mode> <fps>" << endl
             << "Available execution modes: " << endl
             << "1 - simple diff" << endl
             << "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)" << endl
             << "3 - flicker remover on CPU" << endl
             << "4 - flicker remover on GPU" << endl
             << "IMPORTANT: all images and videos should be in << " << cols << "x" << rows << " pixel format." << endl;
        return -1;
    }
    string filename = argv[1];

    string fps_string = argv[3];
    try {
        size_t pos;
        int tmp_fps = stoi(fps_string, &pos);
        if(pos < fps_string.size()) {
            cerr << "Error in <fps> command line parameter. Trailing characters after number: " << fps_string << endl;
            return -1;
        } else if(tmp_fps < 0) {
            cerr << "Error in <fps> command line parameter. Frames per second must have a positive value." << endl;
            return -1;
        } else {
            fps = (unsigned int) tmp_fps;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <fps> command line parameter. Invalid number: " << fps_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <fps> command line parameter. Number out of range: " << fps_string << endl;
        return -1;
    }

    auto directory_path = path(filename);
    bool images_from_dir = false;
    if(is_directory(directory_path)) {
        images_from_dir = true;
        readFilenames(filename, filenames);
        if(filenames.empty()) {
            cerr << "Could not find any jpeg files in directory: "<< filename << "." << endl;
            return -1;
        }
    } else {
        if(!openVideo(video_capture, directory_path.string())) {
            return -1;
        }
    }

    int execution_mode = 0;
    string execution_mode_string = argv[2];
    try {
        size_t pos;
        execution_mode = stoi(execution_mode_string, &pos);
        if(pos < execution_mode_string.size()) {
            cerr << "Error in <execution mode> command line parameter. Trailing characters after number: "
                 << execution_mode_string << endl;
            return -1;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <execution mode> command line parameter. Invalid number: " << execution_mode_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <execution mode> command line parameter. Number out of range: "
             << execution_mode_string << endl;
        return -1;
    }

    switch(execution_mode) {
        case 1:
            cout << "Simple absolute diff of 2 frames." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs."
                         << endl;
                    return -1;
                }
            }
        case 2:
            cout << "Simple absolute diff of 2 frames with all pixels with values "
                 << "different than 0 (black) set to 255 (white)." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs with all pixels "
                         << "with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs "
                         << "with all pixels with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            }
        case 3:
            cout << "Flicker remover on CPU." << endl;
            return flickerRemoverOnCPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        case 4:
            cout << "Flicker remover on GPU." << endl;
            return flickerRemoverOnGPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        default:
            cout << "Unknown execution mode: " << execution_mode_string
                 << ". It should be an integral value from range: 1 - 6." << endl;
            return -1;
    }
}